

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O1

FT_Error psh_hint_table_init(PSH_Hint_Table table,PS_Hint_Table hints,PS_Mask_Table hint_masks,
                            PS_Mask_Table counter_masks,FT_Memory memory)

{
  PS_Hint pPVar1;
  PSH_Hint_conflict *ppPVar2;
  PSH_Hint_conflict pPVar3;
  PSH_ZoneRec *pPVar4;
  PS_Mask pPVar5;
  FT_UInt FVar6;
  long lVar7;
  byte *pbVar8;
  FT_UInt idx;
  FT_UInt idx_00;
  FT_UInt FVar9;
  uint uVar10;
  uint uVar11;
  ulong new_count;
  int local_34 [2];
  FT_Error error;
  
  uVar10 = hints->num_hints;
  new_count = (ulong)uVar10;
  ppPVar2 = (PSH_Hint_conflict *)
            ft_mem_realloc((FT_Memory)counter_masks,8,0,(ulong)(uVar10 * 2),(void *)0x0,local_34);
  table->sort = ppPVar2;
  if (local_34[0] == 0) {
    pPVar3 = (PSH_Hint_conflict)
             ft_mem_realloc((FT_Memory)counter_masks,0x30,0,new_count,(void *)0x0,local_34);
    table->hints = pPVar3;
    if (local_34[0] == 0) {
      pPVar4 = (PSH_ZoneRec *)
               ft_mem_realloc((FT_Memory)counter_masks,0x20,0,(ulong)(uVar10 * 2 | 1),(void *)0x0,
                              local_34);
      table->zones = pPVar4;
      if (local_34[0] == 0) {
        table->max_hints = uVar10;
        table->sort_global = table->sort + new_count;
        table->num_hints = 0;
        table->num_zones = 0;
        table->zone = (PSH_Zone)0x0;
        if (uVar10 != 0) {
          pPVar1 = hints->hints;
          pPVar3 = table->hints;
          lVar7 = 0;
          do {
            (&pPVar3->org_pos)[lVar7] = *(FT_Int *)((long)&pPVar1->pos + lVar7);
            (&pPVar3->org_len)[lVar7] = *(FT_Int *)((long)&pPVar1->len + lVar7);
            (&pPVar3->flags)[lVar7] = *(FT_UInt *)((long)&pPVar1->flags + lVar7);
            lVar7 = lVar7 + 0xc;
            uVar10 = (int)new_count - 1;
            new_count = (ulong)uVar10;
          } while (uVar10 != 0);
        }
        if (hint_masks != (PS_Mask_Table)0x0) {
          pPVar5 = hint_masks->masks;
          FVar6 = hint_masks->num_masks;
          table->hint_masks = hint_masks;
          for (; FVar6 != 0; FVar6 = FVar6 - 1) {
            FVar9 = pPVar5->num_bits;
            if (FVar9 != 0) {
              pbVar8 = pPVar5->bytes;
              uVar11 = 0;
              idx_00 = 0;
              uVar10 = 0;
              do {
                if (uVar11 == 0) {
                  uVar10 = (uint)*pbVar8;
                  pbVar8 = pbVar8 + 1;
                  uVar11 = 0x80;
                }
                if ((uVar11 & uVar10) != 0) {
                  psh_hint_table_record(table,idx_00);
                }
                uVar11 = uVar11 >> 1;
                idx_00 = idx_00 + 1;
              } while (FVar9 != idx_00);
            }
            pPVar5 = pPVar5 + 1;
          }
        }
        FVar6 = table->max_hints;
        if (FVar6 != 0 && table->num_hints != FVar6) {
          FVar9 = 0;
          do {
            psh_hint_table_record(table,FVar9);
            FVar9 = FVar9 + 1;
          } while (FVar6 != FVar9);
        }
      }
    }
  }
  return local_34[0];
}

Assistant:

static FT_Error
  psh_hint_table_init( PSH_Hint_Table  table,
                       PS_Hint_Table   hints,
                       PS_Mask_Table   hint_masks,
                       PS_Mask_Table   counter_masks,
                       FT_Memory       memory )
  {
    FT_UInt   count;
    FT_Error  error;

    FT_UNUSED( counter_masks );


    count = hints->num_hints;

    /* allocate our tables */
    if ( FT_NEW_ARRAY( table->sort,  2 * count     ) ||
         FT_NEW_ARRAY( table->hints,     count     ) ||
         FT_NEW_ARRAY( table->zones, 2 * count + 1 ) )
      goto Exit;

    table->max_hints   = count;
    table->sort_global = table->sort + count;
    table->num_hints   = 0;
    table->num_zones   = 0;
    table->zone        = NULL;

    /* initialize the `table->hints' array */
    {
      PSH_Hint  write = table->hints;
      PS_Hint   read  = hints->hints;


      for ( ; count > 0; count--, write++, read++ )
      {
        write->org_pos = read->pos;
        write->org_len = read->len;
        write->flags   = read->flags;
      }
    }

    /* we now need to determine the initial `parent' stems; first  */
    /* activate the hints that are given by the initial hint masks */
    if ( hint_masks )
    {
      PS_Mask  mask = hint_masks->masks;


      count             = hint_masks->num_masks;
      table->hint_masks = hint_masks;

      for ( ; count > 0; count--, mask++ )
        psh_hint_table_record_mask( table, mask );
    }

    /* finally, do a linear parse in case some hints were left alone */
    if ( table->num_hints != table->max_hints )
    {
      FT_UInt  idx;


      FT_TRACE0(( "psh_hint_table_init: missing/incorrect hint masks\n" ));

      count = table->max_hints;
      for ( idx = 0; idx < count; idx++ )
        psh_hint_table_record( table, idx );
    }

  Exit:
    return error;
  }